

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::OptionalTypename::OptionalTypename
          (OptionalTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *wrappedTypename)

{
  int iVar1;
  pointer pTVar2;
  undefined4 extraout_var;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *wrappedTypename_local;
  OptionalTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__OptionalTypename_0016aa50;
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->m_wrappedTypename,wrappedTypename);
  pTVar2 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&this->m_wrappedTypename);
  iVar1 = (*pTVar2->_vptr_Typename[4])();
  std::operator+(&this->m_name,"?",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

OptionalTypename::OptionalTypename(std::unique_ptr<const Typename> wrappedTypename) :
            m_wrappedTypename{std::move(wrappedTypename)},
            m_name{"?" + m_wrappedTypename->name()} {
    }